

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_hashtable.cc
# Opt level: O3

RC __thiscall PF_HashTable::Delete(PF_HashTable *this,int fd,PageNum pageNum)

{
  PF_HashEntry *pPVar1;
  PF_HashEntry *pPVar2;
  PF_HashEntry *pPVar3;
  int iVar4;
  
  iVar4 = (pageNum + fd) % this->numBuckets;
  pPVar1 = this->hashTable[iVar4];
  pPVar2 = pPVar1;
  while( true ) {
    if (pPVar2 == (PF_HashEntry *)0x0) {
      return -8;
    }
    if ((pPVar2->fd == fd) && (pPVar2->pageNum == pageNum)) break;
    pPVar2 = pPVar2->next;
  }
  pPVar3 = pPVar2->next;
  if (pPVar2 == pPVar1) {
    this->hashTable[iVar4] = pPVar3;
  }
  pPVar1 = pPVar2->prev;
  if (pPVar1 != (PF_HashEntry *)0x0) {
    pPVar1->next = pPVar3;
  }
  if (pPVar3 != (PF_HashEntry *)0x0) {
    pPVar3->prev = pPVar1;
  }
  operator_delete(pPVar2);
  return 0;
}

Assistant:

RC PF_HashTable::Delete(int fd, PageNum pageNum)
{
  // Get which bucket it should be in
  int bucket = Hash(fd, pageNum);

  // Find the entry is in this bucket
  PF_HashEntry *entry;
  for (entry = hashTable[bucket];
       entry != NULL;
       entry = entry->next) {
    if (entry->fd == fd && entry->pageNum == pageNum)
      break;
  }

  // Did we find hash entry?
  if (entry == NULL)
    return (PF_HASHNOTFOUND);

  // Remove this entry
  if (entry == hashTable[bucket])
    hashTable[bucket] = entry->next;
  if (entry->prev != NULL)
    entry->prev->next = entry->next;
  if (entry->next != NULL)
    entry->next->prev = entry->prev;
  delete entry;

  // Return ook
  return (0);
}